

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O3

JSONNode __thiscall JSONWorker::_parse_unformatted(JSONWorker *this,char *json,char *end)

{
  invalid_argument *this_00;
  string *psVar1;
  internalJSONNode *piVar2;
  json_string local_38;
  
  if (*json == '{') {
    if (end[-1] == '}') goto LAB_0017390e;
  }
  else if ((*json == '[') && (end[-1] == ']')) {
LAB_0017390e:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
    piVar2 = internalJSONNode::newInternal(&local_38);
    *(internalJSONNode **)this = piVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return (JSONNode)(internalJSONNode *)this;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  psVar1 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::invalid_argument::invalid_argument(this_00,(string *)psVar1);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

json_throws(std::invalid_argument) {
    #ifdef JSON_COMMENTS
	   json_char firstchar = *json;
	   json_string _comment;
	   json_char * runner = (json_char*)json;
	   if (json_unlikely(firstchar == JSON_TEMP_COMMENT_IDENTIFIER)){  //multiple comments will be consolidated into one
		  newcomment:
		  while(*(++runner) != JSON_TEMP_COMMENT_IDENTIFIER){
			 JSON_ASSERT(runner != end, JSON_TEXT("Removing white space failed"));
			 _comment += *runner;
		  }
		  firstchar = *(++runner); //step past the trailing tag
		  if (json_unlikely(firstchar == JSON_TEMP_COMMENT_IDENTIFIER)){
			 _comment += JSON_TEXT('\n');
			 goto newcomment;
		  }
	   }
    #else
	   const json_char firstchar = *json;
    #endif

    switch (firstchar){
        case JSON_TEXT('{'):
        case JSON_TEXT('['):
		  #if defined JSON_DEBUG || defined JSON_SAFE
			 if (firstchar == JSON_TEXT('[')){
				if (json_unlikely(*(end - 1) != JSON_TEXT(']'))){
				    JSON_FAIL(JSON_TEXT("Missing final ]"));
				    break;
				}
			 } else {
				if (json_unlikely(*(end - 1) != JSON_TEXT('}'))){
				    JSON_FAIL(JSON_TEXT("Missing final }"));
				    break;
				}
			 }
		  #endif
		  #ifdef JSON_COMMENTS
			 JSONNode foo(json_string(runner, end - runner));
			 foo.set_comment(_comment);
			 return JSONNode(true, foo);  //forces it to simply return the original interal, even with ref counting off
		  #else
			 return JSONNode(json_string(json, end - json));
		  #endif
    }

    JSON_FAIL(JSON_TEXT("Not JSON!"));
    #ifndef JSON_NO_EXCEPTIONS
	   throw std::invalid_argument(json_global(EMPTY_STD_STRING));
    #else
	   return JSONNode(JSON_NULL);
    #endif
}